

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O3

void __thiscall
stackjit::ByteCodeParser::parseFunctionBody
          (ByteCodeParser *this,Assembly *assembly,Function *currentFunction)

{
  pointer pbVar1;
  _Alloc_hider _Var2;
  int iVar3;
  vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_> *this_00;
  runtime_error *this_01;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  nextToken_abi_cxx11_(&local_50,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pbVar1 = (this->mTokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_p = pbVar1[this->mTokenIndex]._M_dataplus._M_p;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,_Var2._M_p,_Var2._M_p + pbVar1[this->mTokenIndex]._M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if (iVar3 == 0) {
    nextToken_abi_cxx11_(&local_70,this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    this->mLocalsSet = false;
    while( true ) {
      pbVar1 = (this->mTokens).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var2._M_p = pbVar1[this->mTokenIndex]._M_dataplus._M_p;
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,_Var2._M_p,
                 _Var2._M_p + pbVar1[this->mTokenIndex]._M_string_length);
      iVar3 = std::__cxx11::string::compare((char *)local_b0);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0]);
      }
      if (iVar3 == 0) break;
      parseInstruction(this,currentFunction);
      nextToken_abi_cxx11_(&local_90,this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
    this_00 = Loader::Assembly::functions(assembly);
    std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>::push_back
              (this_00,currentFunction);
    nextTokenAtEnd(this);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Expected \'{\' after function definition.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ByteCodeParser::parseFunctionBody(Loader::Assembly& assembly, Loader::Function& currentFunction) {
		nextToken();
		if (currentToken() != "{") {
			throw std::runtime_error("Expected '{' after function definition.");
		}
		nextToken();

		mLocalsSet = false;
		while (true) {
			if (currentToken() == "}") {
				assembly.functions().push_back(currentFunction);
				nextTokenAtEnd();
				break;
			} else {
				parseInstruction(currentFunction);
			}

			nextToken();
		}
	}